

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VMaxNorm_Serial(N_Vector x)

{
  long lVar1;
  sunrealtype *xd;
  sunrealtype max;
  sunindextype N;
  sunindextype i;
  N_Vector x_local;
  
  max = 0.0;
  lVar1 = *(long *)((long)x->content + 0x10);
  for (i = 0; i < *x->content; i = i + 1) {
    if (max < ABS(*(double *)(lVar1 + i * 8))) {
      max = ABS(*(sunrealtype *)(lVar1 + i * 8));
    }
  }
  return max;
}

Assistant:

sunrealtype N_VMaxNorm_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype max, *xd;

  max = ZERO;
  xd  = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++)
  {
    if (SUNRabs(xd[i]) > max) { max = SUNRabs(xd[i]); }
  }

  return (max);
}